

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

u_char * ngx_pstrdup(ngx_pool_t *pool,ngx_str_t *src)

{
  u_char *dst;
  ngx_str_t *src_local;
  ngx_pool_t *pool_local;
  
  pool_local = (ngx_pool_t *)ngx_pnalloc(pool,src->len);
  if (pool_local == (ngx_pool_t *)0x0) {
    pool_local = (ngx_pool_t *)0x0;
  }
  else {
    memcpy(pool_local,src->data,src->len);
  }
  return (u_char *)pool_local;
}

Assistant:

u_char *
ngx_pstrdup(ngx_pool_t *pool, ngx_str_t *src)
{
    u_char  *dst;

    dst = ngx_pnalloc(pool, src->len);
    if (dst == NULL) {
        return NULL;
    }

    ngx_memcpy(dst, src->data, src->len);

    return dst;
}